

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<unsigned_int,_sptk::uint24_t>::Run
          (DataTransform<unsigned_int,_sptk::uint24_t> *this,istream *input_stream)

{
  byte bVar1;
  int iVar2;
  NumericType NVar3;
  WarningType WVar4;
  bool bVar5;
  char *__nptr;
  bool bVar6;
  int *piVar7;
  undefined8 uVar8;
  ostream *poVar9;
  size_t sVar10;
  uint uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint uVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  uint input_data;
  string word;
  char buffer [128];
  uint24_t local_2a0;
  uint24_t local_29d;
  ushort local_29a;
  ulong local_298;
  uint local_28c;
  uint8_t *local_288;
  uint8_t *local_280;
  uint8_t *local_278;
  uint8_t *local_270;
  istream *local_268;
  string local_260;
  string *local_240;
  long local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_270 = (this->minimum_value_).value + 1;
  local_280 = (this->maximum_value_).value + 1;
  local_288 = (this->maximum_value_).value + 2;
  local_278 = (this->minimum_value_).value + 2;
  local_240 = &this->print_format_;
  local_298 = 0;
  local_268 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      local_228 = 0;
      local_220[0] = '\0';
      local_230 = local_220;
      std::operator>>(local_268,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar5 = true;
        bVar6 = false;
      }
      else {
        piVar7 = __errno_location();
        iVar2 = *piVar7;
        *piVar7 = 0;
        strtold(__nptr,(char **)&local_260);
        if (local_260._M_dataplus._M_p == __nptr) {
          uVar8 = std::__throw_invalid_argument("stold");
LAB_00136873:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar8);
        }
        if (*piVar7 == 0) {
          *piVar7 = iVar2;
        }
        else if (*piVar7 == 0x22) {
          uVar8 = std::__throw_out_of_range("stold");
          goto LAB_00136873;
        }
        local_29a = in_FPUControlWord | 0xc00;
        local_238 = (long)ROUND(in_ST0);
        local_28c = (uint)local_238;
        bVar5 = false;
        bVar6 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar6) goto LAB_00136569;
      if (bVar5) {
        if (!bVar5) {
          return false;
        }
        goto LAB_00136816;
      }
    }
    else {
      bVar6 = sptk::ReadStream<unsigned_int>(&local_28c,local_268);
      if (!bVar6) {
LAB_00136816:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if ((int)((long)((ulong)(uint)((int)local_298 >> 0x1f) << 0x20 | local_298 & 0xffffffff) %
                 (long)this->num_column_) != 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          return true;
        }
        return true;
      }
LAB_00136569:
      uVar14 = (uint)*(uint3 *)(this->minimum_value_).value;
      uVar11 = (uint)*(uint3 *)(this->maximum_value_).value;
      if (((uVar14 < uVar11) &&
          (((NVar3 = this->input_numeric_type_, NVar3 == kFloatingPoint ||
            (NVar3 == kUnsignedInteger)) || (NVar3 == kSignedInteger)))) &&
         ((puVar15 = local_270, puVar16 = local_278, bVar1 = (this->minimum_value_).value[0],
          local_28c < uVar14 ||
          (puVar15 = local_280, puVar16 = local_288, bVar1 = (this->maximum_value_).value[0],
          uVar11 < local_28c)))) {
        uVar12 = *puVar16;
        uVar13 = *puVar15;
        uVar11 = (uint)bVar1;
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)local_298);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"th data is over the range of output type",0x28);
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"x2x","");
          sptk::PrintErrorMessage(&local_260,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          if (WVar4 == kExit) {
            return false;
          }
        }
      }
      else if (this->rounding_ == true) {
        if (local_28c == 0) {
          uVar12 = '\0';
          uVar13 = '\0';
          uVar11 = 0;
        }
        else {
          uVar11 = (uint)((double)local_28c + 0.5);
          uVar13 = (uint8_t)(uVar11 >> 8);
          uVar12 = (uint8_t)(uVar11 >> 0x10);
        }
      }
      else {
        uVar13 = (uint8_t)(local_28c >> 8);
        uVar12 = (uint8_t)(local_28c >> 0x10);
        uVar11 = local_28c;
      }
      if (this->is_ascii_output_ == true) {
        local_29d.value[0] = (uint8_t)uVar11;
        local_29d.value[1] = uVar13;
        local_29d.value[2] = uVar12;
        bVar6 = sptk::SnPrintf<sptk::uint24_t>(&local_29d,local_240,0x80,local_b8);
        if (!bVar6) {
          return false;
        }
        sVar10 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar10);
        if (((int)local_298 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        local_2a0.value[0] = (uint8_t)uVar11;
        local_2a0.value[1] = uVar13;
        local_2a0.value[2] = uVar12;
        bVar6 = sptk::WriteStream<sptk::uint24_t>(&local_2a0,(ostream *)&std::cout);
        if (!bVar6) {
          return false;
        }
      }
    }
    local_298 = (ulong)((int)local_298 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }